

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void clear_refine(saucy *s)

{
  long lVar1;
  
  if (0 < s->nninduce) {
    lVar1 = 0;
    do {
      s->indmark[s->ninduce[lVar1]] = '\0';
      lVar1 = lVar1 + 1;
    } while (lVar1 < s->nninduce);
  }
  if (0 < s->nsinduce) {
    lVar1 = 0;
    do {
      s->indmark[s->sinduce[lVar1]] = '\0';
      lVar1 = lVar1 + 1;
    } while (lVar1 < s->nsinduce);
  }
  s->nninduce = 0;
  s->nsinduce = 0;
  return;
}

Assistant:

static void
clear_refine(struct saucy *s)
{
    int i;
    for (i = 0; i < s->nninduce; ++i) {
        s->indmark[s->ninduce[i]] = 0;
    }
    for (i = 0; i < s->nsinduce; ++i) {
        s->indmark[s->sinduce[i]] = 0;
    }
    s->nninduce = s->nsinduce = 0;
}